

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MaxOperation::Combine<duckdb::MinMaxState<unsigned_long>,duckdb::MaxOperation>
               (MinMaxState<unsigned_long> *source,MinMaxState<unsigned_long> *target,
               AggregateInputData *param_3)

{
  bool bVar1;
  undefined7 uVar2;
  
  if (source->isset == true) {
    if (target->isset == false) {
      bVar1 = source->isset;
      uVar2 = *(undefined7 *)&source->field_0x9;
      target->value = source->value;
      target->isset = bVar1;
      *(undefined7 *)&target->field_0x9 = uVar2;
      return;
    }
    if (target->value < source->value) {
      target->value = source->value;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (LessThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}